

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

LIBSSH2_LISTENER *
libssh2_channel_forward_listen_ex
          (LIBSSH2_SESSION *session,char *host,int port,int *bound_port,int queue_maxsize)

{
  int iVar1;
  time_t start_time;
  LIBSSH2_LISTENER *pLVar2;
  int rc;
  time_t entry_time;
  LIBSSH2_LISTENER *ptr;
  int queue_maxsize_local;
  int *bound_port_local;
  int port_local;
  char *host_local;
  LIBSSH2_SESSION *session_local;
  
  if (session != (LIBSSH2_SESSION *)0x0) {
    start_time = time((time_t *)0x0);
    do {
      pLVar2 = channel_forward_listen(session,host,port,bound_port,queue_maxsize);
      if (session->api_block_mode == 0) {
        return pLVar2;
      }
      if (pLVar2 != (LIBSSH2_LISTENER *)0x0) {
        return pLVar2;
      }
      iVar1 = libssh2_session_last_errno(session);
      if (iVar1 != -0x25) {
        return (LIBSSH2_LISTENER *)0x0;
      }
      iVar1 = _libssh2_wait_socket(session,start_time);
    } while (iVar1 == 0);
  }
  return (LIBSSH2_LISTENER *)0x0;
}

Assistant:

LIBSSH2_API LIBSSH2_LISTENER *
libssh2_channel_forward_listen_ex(LIBSSH2_SESSION *session, const char *host,
                                  int port, int *bound_port, int queue_maxsize)
{
    LIBSSH2_LISTENER *ptr;

    if(!session)
        return NULL;

    BLOCK_ADJUST_ERRNO(ptr, session,
                       channel_forward_listen(session, host, port, bound_port,
                                              queue_maxsize));
    return ptr;
}